

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

insert_return_type * __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
::insert(insert_return_type *__return_storage_ptr__,
        parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
        *this,node_type *node)

{
  aligned_storage_t<sizeof(slot_type),_alignof(slot_type)> *key;
  ctrl_t *pcVar1;
  slot_type *psVar2;
  ctrl_t *pcVar3;
  undefined1 auVar4 [16];
  size_t i;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  *this_00;
  size_t sVar5;
  pair<unsigned_long,_bool> pVar6;
  insert_return_type res;
  bool local_48;
  node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  local_40;
  
  if ((node->
      super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ).alloc_.
      super__Optional_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ._M_engaged == false) {
    (__return_storage_ptr__->position).it_end_.ctrl_ = (ctrl_t *)0x0;
    (__return_storage_ptr__->position).inner_ = (Inner *)0x0;
    (__return_storage_ptr__->position).inner_end_ = (Inner *)0x0;
    (__return_storage_ptr__->position).it_.ctrl_ = (ctrl_t *)0x0;
    __return_storage_ptr__->inserted = false;
    *(bool *)((long)&(__return_storage_ptr__->node).
                     super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                     .alloc_.
                     super__Optional_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
             + 1) = false;
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)**(int **)(node->
                                   super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                                   ).slot_space_.data;
    key = &(node->
           super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
           ).slot_space_;
    sVar5 = SUB168(auVar4 * ZEXT816(0xde5fb9d2630458e9),8) +
            SUB168(auVar4 * ZEXT816(0xde5fb9d2630458e9),0);
    this_00 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
               *)((long)&(this->sets_)._M_elems[0].set_.ctrl_ +
                 (ulong)((((uint)(sVar5 >> 0x18) & 0xff ^
                          (uint)(sVar5 >> 0x10) & 0xffff ^ (uint)(sVar5 >> 8) & 0xffffff) & 0xf) *
                        0x30));
    pVar6 = raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
            ::find_or_prepare_insert<std::unique_ptr<int,std::default_delete<int>>>
                      ((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,std::default_delete<int>>>,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Hash,phmap::priv::(anonymous_namespace)::ParallelFlatHashSet_MergeExtractInsert_Test::TestBody()::Eq,std::allocator<std::unique_ptr<int,std::default_delete<int>>>>
                        *)this_00,(unique_ptr<int,_std::default_delete<int>_> *)key,sVar5);
    i = pVar6.first;
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      this_00->slots_[i]._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
      _M_head_impl = *(int **)key->data;
      *(undefined8 *)key->data = 0;
      raw_hash_set<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_Hash,_Eq,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ::set_ctrl(this_00,i,(byte)sVar5 & 0x7f);
    }
    pcVar1 = this_00->ctrl_;
    psVar2 = this_00->slots_;
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_48 = false;
      local_40.alloc_.
      super__Optional_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ._M_engaged = false;
      node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ::operator=(&local_40,
                  &node->
                   super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                 );
    }
    else {
      if ((node->
          super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
          ).alloc_.
          super__Optional_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
          ._M_engaged == false) {
        __assert_fail("alloc_.has_value()",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                      ,0xb04,
                      "void phmap::priv::node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int>>>, std::allocator<std::unique_ptr<int>>>::reset() [PolicyTraits = phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int>>>, Alloc = std::allocator<std::unique_ptr<int>>]"
                     );
      }
      (node->
      super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ).alloc_.
      super__Optional_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ._M_engaged = false;
      local_48 = true;
      local_40.alloc_.
      super__Optional_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ._M_engaged = false;
    }
    pcVar3 = this_00->ctrl_;
    sVar5 = this_00->capacity_;
    if (pcVar3 + sVar5 == pcVar1 + i) {
      (__return_storage_ptr__->position).it_end_.ctrl_ = (ctrl_t *)0x0;
      (__return_storage_ptr__->position).inner_ = (Inner *)0x0;
      (__return_storage_ptr__->position).inner_end_ = (Inner *)0x0;
      (__return_storage_ptr__->position).it_.ctrl_ = (ctrl_t *)0x0;
    }
    else {
      (__return_storage_ptr__->position).inner_ = (Inner *)this_00;
      (__return_storage_ptr__->position).inner_end_ = (Inner *)(this + 1);
      (__return_storage_ptr__->position).it_.ctrl_ = pcVar1 + i;
      (__return_storage_ptr__->position).it_.field_1.slot_ = psVar2 + i;
      (__return_storage_ptr__->position).it_end_.ctrl_ = pcVar3 + sVar5;
    }
    __return_storage_ptr__->inserted = local_48;
    if (local_48 == true) {
      *(bool *)((long)&(__return_storage_ptr__->node).
                       super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                       .alloc_.
                       super__Optional_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
               + 1) = false;
    }
    else {
      *(bool *)((long)&(__return_storage_ptr__->node).
                       super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                       .alloc_.
                       super__Optional_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
               + 1) = false;
      node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
      ::operator=(&(__return_storage_ptr__->node).
                   super_node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
                  ,&local_40);
    }
    node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::FlatHashSetPolicy<std::unique_ptr<int,_std::default_delete<int>_>_>,_void>,_std::allocator<std::unique_ptr<int,_std::default_delete<int>_>_>_>
    ::~node_handle_base(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

insert_return_type insert(node_type&& node) {
        if (!node) 
            return {end(), false, node_type()};
        auto& key      = node.key();
        size_t hashval = this->hash(key);
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;

        UniqueLock m(inner);
        auto   res  = set.insert(std::move(node), hashval);
        return { make_iterator(&inner, res.position),
                 res.inserted,
                 res.inserted ? node_type() : std::move(res.node) };
    }